

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

void google::protobuf::internal::WireFormat::SerializeFieldWithCachedSizes
               (FieldDescriptor *field,Message *message,CodedOutputStream *output)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  Type TVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar8;
  string *psVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  ulong uVar10;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  long lVar11;
  byte *pbVar12;
  byte *pbVar13;
  uint32 uVar14;
  MapFieldBase *key;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  byte *pbVar18;
  uint64 uVar19;
  undefined4 extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 uVar20;
  float extraout_XMM0_Da_02;
  float value;
  anon_union_8_2_947300a4 anon_var_0;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar21;
  vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> sorted_key_list;
  MapValueRef map_value;
  MapFieldBase *local_a8;
  long local_a0;
  MapFieldBase *local_98;
  undefined1 local_90 [32];
  MapValueRef local_70;
  MapIterator local_60;
  Reflection *reflection;
  undefined4 extraout_var_01;
  
  iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  reflection = (Reflection *)CONCAT44(extraout_var,iVar4);
  if ((((field[0x50] == (FieldDescriptor)0x1) &&
       (*(char *)(*(long *)(*(long *)(field + 0x58) + 0x20) + 0x68) == '\x01')) &&
      (TVar5 = FieldDescriptor::type(field),
      *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar5 * 4) == 10)) &&
     (*(int *)(field + 0x4c) != 3)) {
    SerializeMessageSetItemWithCachedSizes(field,message,output);
    return;
  }
  bVar2 = FieldDescriptor::is_map(field);
  if (bVar2) {
    iVar4 = (*reflection->_vptr_Reflection[0x5b])(reflection,message,field);
    bVar2 = MapFieldBase::IsMapValid((MapFieldBase *)CONCAT44(extraout_var_00,iVar4));
    if (bVar2) {
      uVar8 = io::CodedOutputStream::default_serialization_deterministic_;
      if (output->serialization_deterministic_is_overridden_ != false) {
        uVar8 = (ulong)output->serialization_deterministic_override_;
      }
      if (uVar8 != 0) {
        MapKeySorter::SortKey
                  ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)
                   local_90,message,reflection,field);
        if (local_90._0_8_ != local_90._8_8_) {
          key = (MapFieldBase *)local_90._0_8_;
          do {
            local_60.iter_ = (void *)0x0;
            local_60.map_._0_4_ = 0;
            (*reflection->_vptr_Reflection[0x56])(reflection,message,field,key,&local_60);
            SerializeMapEntry(field,(MapKey *)key,(MapValueRef *)&local_60,output);
            key = (MapFieldBase *)&key->repeated_field_;
          } while (key != (MapFieldBase *)local_90._8_8_);
        }
        std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::~vector
                  ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)
                   local_90);
        return;
      }
      (*reflection->_vptr_Reflection[0x58])(local_90,reflection,message,field);
      while( true ) {
        (*reflection->_vptr_Reflection[0x59])(&local_60,reflection,message,field);
        cVar3 = (**(code **)(((KeyValue *)local_90._8_8_)->int64_value_ + 0x28))
                          (local_90._8_8_,local_90,&local_60);
        MapIterator::~MapIterator(&local_60);
        if (cVar3 != '\0') break;
        SerializeMapEntry(field,(MapKey *)(local_90 + 0x10),&local_70,output);
        (**(code **)(((KeyValue *)local_90._8_8_)->int64_value_ + 0x78))(local_90._8_8_,local_90);
      }
      MapIterator::~MapIterator((MapIterator *)local_90);
      return;
    }
  }
  if (*(int *)(field + 0x4c) == 3) {
    uVar6 = (*reflection->_vptr_Reflection[6])(reflection,message,field);
    if ((1 < (int)uVar6) && (bVar2 = FieldDescriptor::is_map(field), bVar2)) {
      uVar8 = io::CodedOutputStream::default_serialization_deterministic_;
      if (output->serialization_deterministic_is_overridden_ != false) {
        uVar8 = (ulong)output->serialization_deterministic_override_;
      }
      if (uVar8 != 0) {
        DynamicMapSorter::Sort
                  ((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                    *)local_90,message,uVar6,reflection,field);
        local_a8 = (MapFieldBase *)local_90._0_8_;
        local_98 = (MapFieldBase *)local_90._8_8_;
        local_a0 = CONCAT71(local_90._17_7_,local_90[0x10]);
        goto LAB_0033b7ce;
      }
    }
  }
  else if (*(char *)(*(long *)(*(long *)(field + 0x58) + 0x20) + 0x6b) == '\0') {
    uVar6 = (*reflection->_vptr_Reflection[5])(reflection,message,field);
    uVar6 = uVar6 & 0xff;
  }
  else {
    uVar6 = 1;
  }
  local_a8 = (MapFieldBase *)0x0;
  local_98 = (MapFieldBase *)0x0;
  local_a0 = 0;
LAB_0033b7ce:
  bVar2 = FieldDescriptor::is_packed(field);
  if (bVar2 && 0 < (int)uVar6) {
    uVar15 = *(int *)(field + 0x38) * 8 + 2;
    if (output->buffer_size_ < 5) {
      io::CodedOutputStream::WriteVarint32SlowPath(output,uVar15);
    }
    else {
      pbVar13 = output->buffer_;
      pbVar12 = pbVar13;
      uVar14 = uVar15;
      if (0x7f < (uint)(*(int *)(field + 0x38) << 3)) {
        do {
          *pbVar12 = (byte)uVar15 | 0x80;
          uVar14 = uVar15 >> 7;
          pbVar12 = pbVar12 + 1;
          bVar1 = 0x3fff < uVar15;
          uVar15 = uVar14;
        } while (bVar1);
      }
      *pbVar12 = (byte)uVar14;
      iVar4 = ((int)pbVar12 - (int)pbVar13) + 1;
      output->buffer_ = output->buffer_ + iVar4;
      output->buffer_size_ = output->buffer_size_ - iVar4;
    }
    uVar8 = FieldDataOnlyByteSize(field,message);
    if (output->buffer_size_ < 5) {
      io::CodedOutputStream::WriteVarint32SlowPath(output,(uint)uVar8);
    }
    else {
      pbVar13 = output->buffer_;
      pbVar12 = pbVar13;
      if ((uint)uVar8 < 0x80) {
        uVar8 = uVar8 & 0xffffffff;
      }
      else {
        uVar10 = uVar8 & 0xffffffff;
        do {
          uVar15 = (uint)uVar8;
          *pbVar12 = (byte)uVar8 | 0x80;
          uVar8 = uVar10 >> 7;
          pbVar12 = pbVar12 + 1;
          uVar10 = uVar8;
        } while (0x3fff < uVar15);
      }
      *pbVar12 = (byte)uVar8;
      iVar4 = ((int)pbVar12 - (int)pbVar13) + 1;
      output->buffer_ = output->buffer_ + iVar4;
      output->buffer_size_ = output->buffer_size_ - iVar4;
    }
  }
  if (0 < (int)uVar6) {
    uVar8 = 0;
    do {
      TVar5 = FieldDescriptor::type(field);
      switch(TVar5) {
      case TYPE_DOUBLE:
        if (*(int *)(field + 0x4c) == 3) {
          (*reflection->_vptr_Reflection[0x2f])(reflection,message,field);
          uVar20 = extraout_XMM0_Da;
          uVar21 = extraout_XMM0_Db;
        }
        else {
          (*reflection->_vptr_Reflection[0x16])(reflection,message,field);
          uVar20 = extraout_XMM0_Da_01;
          uVar21 = extraout_XMM0_Db_00;
        }
        if (bVar2) {
          io::CodedOutputStream::WriteLittleEndian64(output,CONCAT44(uVar21,uVar20));
        }
        else {
          WireFormatLite::WriteDouble(*(int *)(field + 0x38),(double)CONCAT44(uVar21,uVar20),output)
          ;
        }
        break;
      case TYPE_FLOAT:
        if (*(int *)(field + 0x4c) == 3) {
          (*reflection->_vptr_Reflection[0x2e])(reflection,message,field);
          value = extraout_XMM0_Da_00;
        }
        else {
          (*reflection->_vptr_Reflection[0x15])(reflection,message,field);
          value = extraout_XMM0_Da_02;
        }
        if (bVar2) {
          io::CodedOutputStream::WriteLittleEndian32(output,(uint32)value);
        }
        else {
          WireFormatLite::WriteFloat(*(int *)(field + 0x38),value,output);
        }
        break;
      case TYPE_INT64:
        if (*(int *)(field + 0x4c) == 3) {
          iVar4 = (*reflection->_vptr_Reflection[0x2b])(reflection,message,field);
          uVar10 = CONCAT44(extraout_var_02,iVar4);
        }
        else {
          iVar4 = (*reflection->_vptr_Reflection[0x12])(reflection,message,field);
          uVar10 = CONCAT44(extraout_var_11,iVar4);
        }
        if (bVar2) {
          if (output->buffer_size_ < 10) {
            io::CodedOutputStream::WriteVarint64SlowPath(output,uVar10);
          }
          else {
            pbVar13 = output->buffer_;
            uVar17 = uVar10;
            pbVar12 = pbVar13;
            if (0x7f < uVar10) {
              do {
                *pbVar12 = (byte)uVar17 | 0x80;
                uVar10 = uVar17 >> 7;
                pbVar12 = pbVar12 + 1;
                bVar1 = 0x3fff < uVar17;
                uVar17 = uVar10;
              } while (bVar1);
            }
LAB_0033c2e2:
            iVar4 = (int)pbVar13;
            *pbVar12 = (byte)uVar10;
LAB_0033c3d3:
            lVar11 = (long)(((int)pbVar12 - iVar4) + 1);
LAB_0033c3dc:
            output->buffer_ = output->buffer_ + lVar11;
            output->buffer_size_ = output->buffer_size_ - (int)lVar11;
          }
        }
        else {
          WireFormatLite::WriteInt64(*(int *)(field + 0x38),uVar10,output);
        }
        break;
      case TYPE_UINT64:
        if (*(int *)(field + 0x4c) == 3) {
          iVar4 = (*reflection->_vptr_Reflection[0x2d])(reflection,message,field);
          uVar10 = CONCAT44(extraout_var_04,iVar4);
        }
        else {
          iVar4 = (*reflection->_vptr_Reflection[0x14])(reflection,message,field);
          uVar10 = CONCAT44(extraout_var_13,iVar4);
        }
        if (bVar2) {
          if (9 < output->buffer_size_) {
            pbVar13 = output->buffer_;
            uVar17 = uVar10;
            pbVar12 = pbVar13;
            pbVar18 = pbVar13;
            if (0x7f < uVar10) {
              do {
                *pbVar18 = (byte)uVar17 | 0x80;
                uVar10 = uVar17 >> 7;
                bVar1 = 0x3fff < uVar17;
                uVar17 = uVar10;
                pbVar12 = pbVar18 + 1;
                pbVar18 = pbVar18 + 1;
              } while (bVar1);
            }
            goto LAB_0033c2e2;
          }
          io::CodedOutputStream::WriteVarint64SlowPath(output,uVar10);
        }
        else {
          WireFormatLite::WriteUInt64(*(int *)(field + 0x38),uVar10,output);
        }
        break;
      case TYPE_INT32:
        if (*(int *)(field + 0x4c) == 3) {
          uVar15 = (*reflection->_vptr_Reflection[0x2a])(reflection,message,field);
        }
        else {
          uVar15 = (*reflection->_vptr_Reflection[0x11])(reflection,message,field);
        }
        if (bVar2) {
          uVar10 = (ulong)(int)uVar15;
          if (9 < output->buffer_size_) {
            pbVar13 = output->buffer_;
            pbVar12 = pbVar13;
            uVar19 = uVar10;
            if (0x7f < uVar15) {
              do {
                *pbVar12 = (byte)uVar10 | 0x80;
                uVar19 = uVar10 >> 7;
                pbVar12 = pbVar12 + 1;
                bVar1 = 0x3fff < uVar10;
                uVar10 = uVar19;
              } while (bVar1);
            }
            *pbVar12 = (byte)uVar19;
            lVar11 = (long)(((int)pbVar12 - (int)pbVar13) + 1);
            goto LAB_0033c3dc;
          }
          io::CodedOutputStream::WriteVarint64SlowPath(output,uVar10);
        }
        else {
          WireFormatLite::WriteInt32(*(int *)(field + 0x38),uVar15,output);
        }
        break;
      case TYPE_FIXED64:
        if (*(int *)(field + 0x4c) == 3) {
          iVar4 = (*reflection->_vptr_Reflection[0x2d])(reflection,message,field);
          uVar19 = CONCAT44(extraout_var_06,iVar4);
        }
        else {
          iVar4 = (*reflection->_vptr_Reflection[0x14])(reflection,message,field);
          uVar19 = CONCAT44(extraout_var_15,iVar4);
        }
        if (bVar2) {
          io::CodedOutputStream::WriteLittleEndian64(output,uVar19);
        }
        else {
          WireFormatLite::WriteFixed64(*(int *)(field + 0x38),uVar19,output);
        }
        break;
      case TYPE_FIXED32:
        if (*(int *)(field + 0x4c) == 3) {
          uVar14 = (*reflection->_vptr_Reflection[0x2c])(reflection,message,field);
        }
        else {
          uVar14 = (*reflection->_vptr_Reflection[0x13])(reflection,message,field);
        }
        if (bVar2) {
          io::CodedOutputStream::WriteLittleEndian32(output,uVar14);
        }
        else {
          WireFormatLite::WriteFixed32(*(int *)(field + 0x38),uVar14,output);
        }
        break;
      case TYPE_BOOL:
        if (*(int *)(field + 0x4c) == 3) {
          uVar15 = (*reflection->_vptr_Reflection[0x30])(reflection,message,field);
        }
        else {
          uVar15 = (*reflection->_vptr_Reflection[0x17])(reflection,message,field);
        }
        if (bVar2) {
          if (output->buffer_size_ < 5) {
            io::CodedOutputStream::WriteVarint32SlowPath(output,uVar15 & 0xff);
          }
          else {
            *output->buffer_ = SUB41(uVar15,0);
            output->buffer_ = output->buffer_ + 1;
            output->buffer_size_ = output->buffer_size_ + -1;
          }
        }
        else {
          WireFormatLite::WriteBool(*(int *)(field + 0x38),SUB41(uVar15,0),output);
        }
        break;
      case TYPE_STRING:
        local_90._0_8_ = local_90 + 0x10;
        local_90._8_8_ = (MapFieldBase *)0x0;
        local_90[0x10] = false;
        if (*(int *)(field + 0x4c) == 3) {
          iVar4 = (*reflection->_vptr_Reflection[0x35])
                            (reflection,message,field,uVar8 & 0xffffffff,local_90);
          psVar9 = (string *)CONCAT44(extraout_var_08,iVar4);
        }
        else {
          iVar4 = (*reflection->_vptr_Reflection[0x1c])(reflection,message,field,local_90);
          psVar9 = (string *)CONCAT44(extraout_var_18,iVar4);
        }
        WireFormatLite::VerifyUtf8String
                  ((psVar9->_M_dataplus)._M_p,(int)psVar9->_M_string_length,SERIALIZE,
                   (char *)**(undefined8 **)(field + 8));
        WireFormatLite::WriteString(*(int *)(field + 0x38),psVar9,output);
        goto LAB_0033c1ce;
      case TYPE_GROUP:
        iVar4 = *(int *)(field + 0x38);
        if (*(int *)(field + 0x4c) == 3) {
          if (local_a8 == local_98) {
            iVar7 = (*reflection->_vptr_Reflection[0x34])(reflection,message,field);
            psVar9 = (string *)CONCAT44(extraout_var_19,iVar7);
          }
          else {
            psVar9 = ((KeyValue *)&local_a8->_vptr_MapFieldBase)[uVar8].string_value_;
          }
        }
        else {
          iVar7 = (*reflection->_vptr_Reflection[0x1b])(reflection,message,field);
          psVar9 = (string *)CONCAT44(extraout_var_10,iVar7);
        }
        WireFormatLite::WriteGroup(iVar4,(MessageLite *)psVar9,output);
        break;
      case TYPE_MESSAGE:
        iVar4 = *(int *)(field + 0x38);
        if (*(int *)(field + 0x4c) == 3) {
          if (local_a8 == local_98) {
            iVar7 = (*reflection->_vptr_Reflection[0x34])(reflection,message,field);
            psVar9 = (string *)CONCAT44(extraout_var_20,iVar7);
          }
          else {
            psVar9 = ((KeyValue *)&local_a8->_vptr_MapFieldBase)[uVar8].string_value_;
          }
        }
        else {
          iVar7 = (*reflection->_vptr_Reflection[0x1b])(reflection,message,field,0);
          psVar9 = (string *)CONCAT44(extraout_var_17,iVar7);
        }
        WireFormatLite::WriteMessage(iVar4,(MessageLite *)psVar9,output);
        break;
      case TYPE_BYTES:
        local_90._0_8_ = local_90 + 0x10;
        local_90._8_8_ = (MapFieldBase *)0x0;
        local_90[0x10] = false;
        if (*(int *)(field + 0x4c) == 3) {
          iVar4 = (*reflection->_vptr_Reflection[0x35])
                            (reflection,message,field,uVar8 & 0xffffffff,local_90);
          psVar9 = (string *)CONCAT44(extraout_var_01,iVar4);
        }
        else {
          iVar4 = (*reflection->_vptr_Reflection[0x1c])(reflection,message,field,local_90);
          psVar9 = (string *)CONCAT44(extraout_var_09,iVar4);
        }
        WireFormatLite::WriteBytes(*(int *)(field + 0x38),psVar9,output);
LAB_0033c1ce:
        if ((MapFieldBase *)local_90._0_8_ != (MapFieldBase *)(local_90 + 0x10)) {
          operator_delete((void *)local_90._0_8_,CONCAT71(local_90._17_7_,local_90[0x10]) + 1);
        }
        break;
      case TYPE_UINT32:
        if (*(int *)(field + 0x4c) == 3) {
          uVar15 = (*reflection->_vptr_Reflection[0x2c])
                             (reflection,message,field,uVar8 & 0xffffffff);
        }
        else {
          uVar15 = (*reflection->_vptr_Reflection[0x13])(reflection,message,field);
        }
        if (bVar2) {
          if (4 < output->buffer_size_) {
            pbVar13 = output->buffer_;
            pbVar12 = pbVar13;
            uVar16 = uVar15;
            if (0x7f < uVar15) {
              do {
                *pbVar12 = (byte)uVar16 | 0x80;
                uVar15 = uVar16 >> 7;
                pbVar12 = pbVar12 + 1;
                bVar1 = 0x3fff < uVar16;
                uVar16 = uVar15;
              } while (bVar1);
            }
LAB_0033c3d0:
            iVar4 = (int)pbVar13;
            *pbVar12 = (byte)uVar15;
            goto LAB_0033c3d3;
          }
          io::CodedOutputStream::WriteVarint32SlowPath(output,uVar15);
        }
        else {
          WireFormatLite::WriteUInt32(*(int *)(field + 0x38),uVar15,output);
        }
        break;
      case TYPE_ENUM:
        if (*(int *)(field + 0x4c) == 3) {
          iVar4 = (*reflection->_vptr_Reflection[0x32])(reflection,message,field,uVar8 & 0xffffffff)
          ;
          lVar11 = CONCAT44(extraout_var_07,iVar4);
        }
        else {
          iVar4 = (*reflection->_vptr_Reflection[0x19])(reflection,message,field);
          lVar11 = CONCAT44(extraout_var_16,iVar4);
        }
        if (bVar2) {
          uVar10 = (ulong)(int)*(uint *)(lVar11 + 0x10);
          if (9 < output->buffer_size_) {
            pbVar13 = output->buffer_;
            pbVar12 = pbVar13;
            uVar19 = uVar10;
            if (0x7f < *(uint *)(lVar11 + 0x10)) {
              do {
                *pbVar12 = (byte)uVar10 | 0x80;
                uVar19 = uVar10 >> 7;
                pbVar12 = pbVar12 + 1;
                bVar1 = 0x3fff < uVar10;
                uVar10 = uVar19;
              } while (bVar1);
            }
            *pbVar12 = (byte)uVar19;
            lVar11 = (long)(((int)pbVar12 - (int)pbVar13) + 1);
            goto LAB_0033c3dc;
          }
          io::CodedOutputStream::WriteVarint64SlowPath(output,uVar10);
        }
        else {
          WireFormatLite::WriteEnum(*(int *)(field + 0x38),*(int *)(lVar11 + 0x10),output);
        }
        break;
      case TYPE_SFIXED32:
        if (*(int *)(field + 0x4c) == 3) {
          uVar14 = (*reflection->_vptr_Reflection[0x2a])
                             (reflection,message,field,uVar8 & 0xffffffff);
        }
        else {
          uVar14 = (*reflection->_vptr_Reflection[0x11])(reflection,message,field);
        }
        if (bVar2) {
          io::CodedOutputStream::WriteLittleEndian32(output,uVar14);
        }
        else {
          WireFormatLite::WriteSFixed32(*(int *)(field + 0x38),uVar14,output);
        }
        break;
      case TYPE_SFIXED64:
        if (*(int *)(field + 0x4c) == 3) {
          iVar4 = (*reflection->_vptr_Reflection[0x2b])(reflection,message,field,uVar8 & 0xffffffff)
          ;
          uVar19 = CONCAT44(extraout_var_03,iVar4);
        }
        else {
          iVar4 = (*reflection->_vptr_Reflection[0x12])(reflection,message,field);
          uVar19 = CONCAT44(extraout_var_12,iVar4);
        }
        if (bVar2) {
          io::CodedOutputStream::WriteLittleEndian64(output,uVar19);
        }
        else {
          WireFormatLite::WriteSFixed64(*(int *)(field + 0x38),uVar19,output);
        }
        break;
      case TYPE_SINT32:
        if (*(int *)(field + 0x4c) == 3) {
          iVar4 = (*reflection->_vptr_Reflection[0x2a])(reflection,message,field,uVar8 & 0xffffffff)
          ;
        }
        else {
          iVar4 = (*reflection->_vptr_Reflection[0x11])(reflection,message,field);
        }
        if (bVar2) {
          uVar15 = iVar4 >> 0x1f ^ iVar4 * 2;
          if (4 < output->buffer_size_) {
            pbVar13 = output->buffer_;
            pbVar12 = pbVar13;
            pbVar18 = pbVar13;
            if (0x7f < uVar15) {
              do {
                *pbVar18 = (byte)uVar15 | 0x80;
                uVar16 = uVar15 >> 7;
                bVar1 = 0x3fff < uVar15;
                pbVar12 = pbVar18 + 1;
                pbVar18 = pbVar18 + 1;
                uVar15 = uVar16;
              } while (bVar1);
            }
            goto LAB_0033c3d0;
          }
          io::CodedOutputStream::WriteVarint32SlowPath(output,uVar15);
        }
        else {
          WireFormatLite::WriteSInt32(*(int *)(field + 0x38),iVar4,output);
        }
        break;
      case MAX_TYPE:
        if (*(int *)(field + 0x4c) == 3) {
          iVar4 = (*reflection->_vptr_Reflection[0x2b])(reflection,message,field,uVar8 & 0xffffffff)
          ;
          lVar11 = CONCAT44(extraout_var_05,iVar4);
        }
        else {
          iVar4 = (*reflection->_vptr_Reflection[0x12])(reflection,message,field);
          lVar11 = CONCAT44(extraout_var_14,iVar4);
        }
        if (bVar2) {
          uVar10 = lVar11 >> 0x3f ^ lVar11 * 2;
          if (9 < output->buffer_size_) {
            pbVar13 = output->buffer_;
            pbVar12 = pbVar13;
            if (0x7f < uVar10) {
              do {
                *pbVar12 = (byte)uVar10 | 0x80;
                uVar17 = uVar10 >> 7;
                pbVar12 = pbVar12 + 1;
                bVar1 = 0x3fff < uVar10;
                uVar10 = uVar17;
              } while (bVar1);
            }
            goto LAB_0033c2e2;
          }
          io::CodedOutputStream::WriteVarint64SlowPath(output,uVar10);
        }
        else {
          WireFormatLite::WriteSInt64(*(int *)(field + 0x38),lVar11,output);
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar6);
  }
  if (local_a8 != (MapFieldBase *)0x0) {
    operator_delete(local_a8,local_a0 - (long)local_a8);
  }
  return;
}

Assistant:

void WireFormat::SerializeFieldWithCachedSizes(
    const FieldDescriptor* field,
    const Message& message,
    io::CodedOutputStream* output) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    SerializeMessageSetItemWithCachedSizes(field, message, output);
    return;
  }

  // For map fields, we can use either repeated field reflection or map
  // reflection.  Our choice has some subtle effects.  If we use repeated field
  // reflection here, then the repeated field representation becomes
  // authoritative for this field: any existing references that came from map
  // reflection remain valid for reading, but mutations to them are lost and
  // will be overwritten next time we call map reflection!
  //
  // So far this mainly affects Python, which keeps long-term references to map
  // values around, and always uses map reflection.  See: b/35918691
  //
  // Here we choose to use map reflection API as long as the internal
  // map is valid. In this way, the serialization doesn't change map field's
  // internal state and existing references that came from map reflection remain
  // valid for both reading and writing.
  if (field->is_map()) {
    MapFieldBase* map_field =
        message_reflection->MapData(const_cast<Message*>(&message), field);
    if (map_field->IsMapValid()) {
      if (output->IsSerializationDeterministic()) {
        std::vector<MapKey> sorted_key_list =
            MapKeySorter::SortKey(message, message_reflection, field);
        for (std::vector<MapKey>::iterator it = sorted_key_list.begin();
             it != sorted_key_list.end(); ++it) {
          MapValueRef map_value;
          message_reflection->InsertOrLookupMapValue(
              const_cast<Message*>(&message), field, *it, &map_value);
          SerializeMapEntry(field, *it, map_value, output);
        }
      } else {
        for (MapIterator it = message_reflection->MapBegin(
                 const_cast<Message*>(&message), field);
             it !=
             message_reflection->MapEnd(const_cast<Message*>(&message), field);
             ++it) {
          SerializeMapEntry(field, it.GetKey(), it.GetValueRef(), output);
        }
      }

      return;
    }
  }

  int count = 0;

  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  // map_entries is for maps that'll be deterministically serialized.
  std::vector<const Message*> map_entries;
  if (count > 1 && field->is_map() && output->IsSerializationDeterministic()) {
    map_entries =
        DynamicMapSorter::Sort(message, count, message_reflection, field);
  }

  const bool is_packed = field->is_packed();
  if (is_packed && count > 0) {
    WireFormatLite::WriteTag(field->number(),
        WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    const size_t data_size = FieldDataOnlyByteSize(field, message);
    output->WriteVarint32(data_size);
  }

  for (int j = 0; j < count; j++) {
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)      \
      case FieldDescriptor::TYPE_##TYPE: {                                     \
        const CPPTYPE value = field->is_repeated() ?                           \
                              message_reflection->GetRepeated##CPPTYPE_METHOD( \
                                message, field, j) :                           \
                              message_reflection->Get##CPPTYPE_METHOD(         \
                                message, field);                               \
        if (is_packed) {                                                       \
          WireFormatLite::Write##TYPE_METHOD##NoTag(value, output);            \
        } else {                                                               \
          WireFormatLite::Write##TYPE_METHOD(field->number(), value, output);  \
        }                                                                      \
        break;                                                                 \
      }

      HANDLE_PRIMITIVE_TYPE( INT32,  int32,  Int32,  Int32)
      HANDLE_PRIMITIVE_TYPE( INT64,  int64,  Int64,  Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32,  int32, SInt32,  Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64,  int64, SInt64,  Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64, UInt64, UInt64)

      HANDLE_PRIMITIVE_TYPE( FIXED32, uint32,  Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE( FIXED64, uint64,  Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32,  int32, SFixed32,  Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64,  int64, SFixed64,  Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT , float , Float , Float )
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE

#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                      \
      case FieldDescriptor::TYPE_##TYPE:                                    \
        WireFormatLite::Write##TYPE_METHOD(                                 \
              field->number(),                                              \
              field->is_repeated() ?                                        \
                (map_entries.empty() ?                                      \
                     message_reflection->GetRepeated##CPPTYPE_METHOD(       \
                                     message, field, j) :                   \
                     *map_entries[j]) :                                     \
                message_reflection->Get##CPPTYPE_METHOD(message, field),    \
              output);                                                      \
        break;

      HANDLE_TYPE(GROUP  , Group  , Message)
      HANDLE_TYPE(MESSAGE, Message, Message)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        const EnumValueDescriptor* value = field->is_repeated() ?
          message_reflection->GetRepeatedEnum(message, field, j) :
          message_reflection->GetEnum(message, field);
        if (is_packed) {
          WireFormatLite::WriteEnumNoTag(value->number(), output);
        } else {
          WireFormatLite::WriteEnum(field->number(), value->number(), output);
        }
        break;
      }

      // Handle strings separately so that we can get string references
      // instead of copying.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = StrictUtf8Check(field);
        string scratch;
        const string& value = field->is_repeated() ?
          message_reflection->GetRepeatedStringReference(
            message, field, j, &scratch) :
          message_reflection->GetStringReference(message, field, &scratch);
        if (strict_utf8_check) {
          WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                           WireFormatLite::SERIALIZE,
                                           field->full_name().c_str());
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), SERIALIZE,
                                     field->full_name().c_str());
        }
        WireFormatLite::WriteString(field->number(), value, output);
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        string scratch;
        const string& value = field->is_repeated() ?
          message_reflection->GetRepeatedStringReference(
            message, field, j, &scratch) :
          message_reflection->GetStringReference(message, field, &scratch);
        WireFormatLite::WriteBytes(field->number(), value, output);
        break;
      }
    }
  }
}